

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createTextureQueryCall
          (Builder *this,Op opCode,TextureParameters *parameters,bool isUnsignedResult)

{
  bool bVar1;
  Id IVar2;
  Dim DVar3;
  Id IVar4;
  Instruction *pIVar5;
  pointer *__ptr;
  int size;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  if (opCode - OpImageQuerySizeLod < 2) {
    IVar2 = getImageType(this,parameters->sampler);
    DVar3 = getTypeDimensionality(this,IVar2);
    if (DimSubpassData < DVar3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xd18,
                    "Id spv::Builder::createTextureQueryCall(Op, const TextureParameters &, bool)");
    }
    IVar2 = getImageType(this,parameters->sampler);
    bVar1 = isArrayedImageType(this,IVar2);
    size = (uint)bVar1 + *(int *)(&DAT_0060c4a4 + (ulong)DVar3 * 4);
    if (isUnsignedResult) {
      IVar2 = makeUintType(this,0x20);
    }
    else {
      IVar2 = makeIntType(this,0x20);
    }
    if (size == 1) goto LAB_00361e70;
  }
  else {
    if (opCode - OpImageQueryLevels < 2) {
      if (isUnsignedResult) {
        IVar2 = makeUintType(this,0x20);
      }
      else {
        IVar2 = makeIntType(this,0x20);
      }
      goto LAB_00361e70;
    }
    if (opCode != OpImageQueryLod) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xd2e,
                    "Id spv::Builder::createTextureQueryCall(Op, const TextureParameters &, bool)");
    }
    pIVar5 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[parameters->coords];
    if (pIVar5 == (Instruction *)0x0) {
      IVar2 = 0;
    }
    else {
      IVar2 = pIVar5->typeId;
    }
    IVar2 = getScalarTypeId(this,IVar2);
    size = 2;
  }
  IVar2 = makeVectorType(this,IVar2,size);
LAB_00361e70:
  pIVar5 = (Instruction *)::operator_new(0x60);
  IVar4 = this->uniqueId + 1;
  this->uniqueId = IVar4;
  pIVar5->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
  pIVar5->resultId = IVar4;
  pIVar5->typeId = IVar2;
  pIVar5->opCode = opCode;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar5->block = (Block *)0x0;
  Instruction::addIdOperand(pIVar5,parameters->sampler);
  if (parameters->coords != 0) {
    Instruction::addIdOperand(pIVar5,parameters->coords);
  }
  if (parameters->lod != 0) {
    Instruction::addIdOperand(pIVar5,parameters->lod);
  }
  local_38._M_head_impl = pIVar5;
  addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  addCapability(this,CapabilityImageQuery);
  return pIVar5->resultId;
}

Assistant:

Id Builder::createTextureQueryCall(Op opCode, const TextureParameters& parameters, bool isUnsignedResult)
{
    // Figure out the result type
    Id resultType = 0;
    switch (opCode) {
    case OpImageQuerySize:
    case OpImageQuerySizeLod:
    {
        int numComponents = 0;
        switch (getTypeDimensionality(getImageType(parameters.sampler))) {
        case Dim1D:
        case DimBuffer:
            numComponents = 1;
            break;
        case Dim2D:
        case DimCube:
        case DimRect:
        case DimSubpassData:
            numComponents = 2;
            break;
        case Dim3D:
            numComponents = 3;
            break;

        default:
            assert(0);
            break;
        }
        if (isArrayedImageType(getImageType(parameters.sampler)))
            ++numComponents;

        Id intType = isUnsignedResult ? makeUintType(32) : makeIntType(32);
        if (numComponents == 1)
            resultType = intType;
        else
            resultType = makeVectorType(intType, numComponents);

        break;
    }
    case OpImageQueryLod:
        resultType = makeVectorType(getScalarTypeId(getTypeId(parameters.coords)), 2);
        break;
    case OpImageQueryLevels:
    case OpImageQuerySamples:
        resultType = isUnsignedResult ? makeUintType(32) : makeIntType(32);
        break;
    default:
        assert(0);
        break;
    }

    Instruction* query = new Instruction(getUniqueId(), resultType, opCode);
    query->addIdOperand(parameters.sampler);
    if (parameters.coords)
        query->addIdOperand(parameters.coords);
    if (parameters.lod)
        query->addIdOperand(parameters.lod);
    addInstruction(std::unique_ptr<Instruction>(query));
    addCapability(CapabilityImageQuery);

    return query->getResultId();
}